

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::enterExecutingModeAsync(Federate *this,IterationRequest iterate)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<helics::iteration_time> *p_Var4;
  InvalidFunctionCall *this_00;
  char *pcVar5;
  pointer *__ptr;
  size_t sVar6;
  _State_baseV2 *__tmp;
  string_view message;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  handle asyncInfo;
  long *local_88;
  undefined4 local_7f;
  undefined3 uStack_7b;
  __basic_future<helics::iteration_time> local_78;
  __state_type local_68;
  _func_int **local_58 [2];
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_48;
  unique_lock<std::mutex> local_40;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "Async function calls and methods are not allowed for single thread federates";
    sVar6 = 0x4c;
LAB_0023b876:
    message._M_str = pcVar5;
    message._M_len = sVar6;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  switch((this->currentMode)._M_i) {
  case STARTUP:
    local_48 = (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl;
    local_40._M_device = &local_48->m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    LOCK();
    (this->currentMode)._M_i = PENDING_EXEC;
    UNLOCK();
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0054a908;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0054a958;
    p_Var4 = (_Result<helics::iteration_time> *)operator_new(0x28);
    std::__future_base::_Result<helics::iteration_time>::_Result(p_Var4);
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(Federate **)&p_Var3[4]._M_use_count = this;
    *(IterationRequest *)&p_Var3[5]._vptr__Sp_counted_base = iterate;
    *(undefined4 *)((long)&p_Var3[5]._vptr__Sp_counted_base + 1) = local_7f;
    *(uint *)((long)&p_Var3[5]._vptr__Sp_counted_base + 4) = CONCAT31(uStack_7b,local_7f._3_1_);
    local_58[0] = (_func_int **)0x0;
    local_88 = (long *)operator_new(0x20);
    *local_88 = (long)&PTR___State_0054a9b0;
    local_88[1] = (long)(p_Var3 + 1);
    local_88[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:553:30)>_>,_helics::iteration_time>
                        ::_M_run;
    local_88[3] = 0;
    std::thread::_M_start_thread(local_58,&local_88,0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0023b894;
    p_Var3[3]._vptr__Sp_counted_base = local_58[0];
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var3 + 1);
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
    std::__basic_future<helics::iteration_time>::__basic_future(&local_78,&local_68);
    break;
  case EXECUTING:
  case PENDING_EXEC:
  case PENDING_TIME:
  case PENDING_ITERATIVE_TIME:
    goto switchD_0023b587_caseD_2;
  default:
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "cannot transition from current state to execution state";
    sVar6 = 0x37;
    goto LAB_0023b876;
  case PENDING_INIT:
    enterInitializingModeComplete(this);
  case INITIALIZING:
    local_48 = (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl;
    local_40._M_device = &local_48->m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    LOCK();
    (this->currentMode)._M_i = PENDING_EXEC;
    UNLOCK();
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0054a9f0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0054aa40;
    p_Var4 = (_Result<helics::iteration_time> *)operator_new(0x28);
    std::__future_base::_Result<helics::iteration_time>::_Result(p_Var4);
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(Federate **)&p_Var3[4]._M_use_count = this;
    *(IterationRequest *)&p_Var3[5]._vptr__Sp_counted_base = iterate;
    *(undefined4 *)((long)&p_Var3[5]._vptr__Sp_counted_base + 1) = local_7f;
    *(uint *)((long)&p_Var3[5]._vptr__Sp_counted_base + 4) = CONCAT31(uStack_7b,local_7f._3_1_);
    local_58[0] = (_func_int **)0x0;
    local_88 = (long *)operator_new(0x20);
    *local_88 = (long)&PTR___State_0054aa98;
    local_88[1] = (long)(p_Var3 + 1);
    local_88[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:570:30)>_>,_helics::iteration_time>
                        ::_M_run;
    local_88[3] = 0;
    std::thread::_M_start_thread(local_58,&local_88,0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_0023b894:
      std::terminate();
    }
    p_Var3[3]._vptr__Sp_counted_base = local_58[0];
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var3 + 1);
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
    std::__basic_future<helics::iteration_time>::__basic_future(&local_78,&local_68);
  }
  if (local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var2._M_pi = local_78._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar1 = local_78._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_48->m_obj).execFuture.super___basic_future<helics::iteration_time>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (local_48->m_obj).execFuture.super___basic_future<helics::iteration_time>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (local_48->m_obj).execFuture.super___basic_future<helics::iteration_time>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
     local_78._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
     _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
switchD_0023b587_caseD_2:
  return;
}

Assistant:

void Federate::enterExecutingModeAsync(IterationRequest iterate)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    switch (currentMode) {
        case Modes::STARTUP: {
            auto eExecFunc = [this, iterate]() {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }
                coreObject->enterInitializingMode(fedID);
                mCurrentTime = coreObject->getCurrentTime(fedID);
                startupToInitializeStateTransition();
                return coreObject->enterExecutingMode(fedID, iterate);
            };
            auto asyncInfo = asyncCallInfo->lock();
            updateFederateMode(Modes::PENDING_EXEC);
            asyncInfo->execFuture = std::async(std::launch::async, eExecFunc);
        } break;
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            [[fallthrough]];
        case Modes::INITIALIZING: {
            auto eExecFunc = [this, iterate]() {
                return coreObject->enterExecutingMode(fedID, iterate);
            };
            auto asyncInfo = asyncCallInfo->lock();
            updateFederateMode(Modes::PENDING_EXEC);
            asyncInfo->execFuture = std::async(std::launch::async, eExecFunc);
        } break;
        case Modes::PENDING_EXEC:
        case Modes::EXECUTING:
        case Modes::PENDING_TIME:
        case Modes::PENDING_ITERATIVE_TIME:
            // we are already in or executing a function that would achieve this request
            break;
        default:
            throw(InvalidFunctionCall("cannot transition from current state to execution state"));
            break;
    }
}